

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

bool __thiscall Escape::CGraph::isEdgeBinary(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = this->offsets[v1];
  lVar2 = this->offsets[v1 + 1];
  bVar1 = lVar4 < lVar2;
  if (lVar4 < lVar2) {
    lVar3 = (lVar2 + lVar4 + -1) / 2;
    lVar5 = this->nbors[lVar3];
    if (lVar5 != v2) {
      lVar2 = lVar2 + -1;
      do {
        if (v2 < lVar5) {
          lVar2 = lVar3 + -1;
        }
        else {
          lVar4 = lVar3 + 1;
        }
        bVar1 = lVar4 <= lVar2;
        if (lVar2 < lVar4) {
          return bVar1;
        }
        lVar3 = (lVar2 + lVar4) / 2;
        lVar5 = this->nbors[lVar3];
      } while (lVar5 != v2);
    }
  }
  return bVar1;
}

Assistant:

bool CGraph::isEdgeBinary(VertexIdx v1, VertexIdx v2) const {
//     VertexIdx deg1 = offsets[v1+1] - offsets[v1];
//     VertexIdx deg2 = offsets[v2+1] - offsets[v2];

//     if(deg2 < deg1)
//     {
//         VertexIdx swp = v1;
//         v1 = v2;
//         v2 = swp;
//     }
//
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;

    while (low <= high) {
        mid = (low + high) / 2;

        if (nbors[mid] == v2)
            return true;
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return false;
}